

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O0

void lf::assemble::test::output_entities_dofs(Mesh *mesh,DofHandler *dof_handler)

{
  bool bVar1;
  uint uVar2;
  Message *pMVar3;
  char *pcVar4;
  ostream *poVar5;
  void *this;
  char *in_R9;
  undefined1 auVar6 [16];
  string local_e8;
  AssertHelper local_c8;
  uint local_bc;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  gdof_idx_t *dof;
  iterator __end3;
  iterator __begin3;
  span<const_long,_18446744073709551615UL> *__range3;
  undefined1 auStack_78 [7];
  bool dof_found;
  span<const_long,_18446744073709551615UL> doflist;
  Entity *e;
  gdof_idx_t dof_idx;
  size_type N_dofs;
  Message local_48 [3];
  int local_30;
  uint local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  DofHandler *dof_handler_local;
  Mesh *mesh_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )dof_handler;
  local_2c = (**mesh->_vptr_Mesh)();
  local_30 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_28,"mesh.DimMesh()","2",&local_2c,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pMVar3 = testing::Message::operator<<(local_48,(char (*) [19])"Only for 2D meshes");
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffb0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  dof_idx._4_4_ =
       (**(code **)(*(long *)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0x10))();
  poVar5 = std::operator<<((ostream *)&std::cout,"#### Entities associated with DOFs");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  e = (Entity *)0x0;
  do {
    if ((long)(ulong)dof_idx._4_4_ <= (long)e) {
      return;
    }
    doflist._M_extent._M_extent_value =
         (**(code **)(*(long *)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 0x38))
                   (gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl,e);
    poVar5 = std::operator<<((ostream *)&std::cout,"dof ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)e);
    poVar5 = std::operator<<(poVar5," -> ");
    poVar5 = lf::mesh::operator<<(poVar5,(Entity *)doflist._M_extent._M_extent_value);
    poVar5 = std::operator<<(poVar5," ");
    uVar2 = (*mesh->_vptr_Mesh[5])(mesh,doflist._M_extent._M_extent_value);
    this = (void *)std::ostream::operator<<(poVar5,uVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    auVar6 = (**(code **)(*(long *)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl + 0x28))
                       (gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,doflist._M_extent._M_extent_value);
    doflist._M_ptr = auVar6._8_8_;
    _auStack_78 = auVar6._0_8_;
    __range3._7_1_ = 0;
    __end3 = std::span<const_long,_18446744073709551615UL>::begin
                       ((span<const_long,_18446744073709551615UL> *)auStack_78);
    dof = (gdof_idx_t *)
          std::span<const_long,_18446744073709551615UL>::end
                    ((span<const_long,_18446744073709551615UL> *)auStack_78);
    while (bVar1 = __gnu_cxx::
                   operator==<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                                       *)&dof), ((bVar1 ^ 0xffU) & 1) != 0) {
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>::
             operator*(&__end3);
      if (*(Entity **)
           gtest_ar_.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl == e) {
        __range3._7_1_ = 1;
        break;
      }
      __gnu_cxx::__normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>::
      operator++(&__end3);
    }
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b0,(bool *)((long)&__range3 + 7),(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pMVar3 = testing::Message::operator<<(&local_b8,(char (*) [5])"DOF ");
      pMVar3 = testing::Message::operator<<(pMVar3,(long *)&e);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [18])" not in list for ");
      pMVar3 = testing::Message::operator<<(pMVar3,(Entity *)doflist._M_extent._M_extent_value);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])0x4a7a05);
      local_bc = (*mesh->_vptr_Mesh[5])(mesh,doflist._M_extent._M_extent_value);
      pMVar3 = testing::Message::operator<<(pMVar3,&local_bc);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_b0,(AssertionResult *)"dof_found","false","true",in_R9)
      ;
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&local_e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                 ,0x94,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c8,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    e = (Entity *)((long)&e->_vptr_Entity + 1);
  } while( true );
}

Assistant:

void output_entities_dofs(const lf::mesh::Mesh &mesh,
                          const lf::assemble::DofHandler &dof_handler) {
  EXPECT_EQ(mesh.DimMesh(), 2) << "Only for 2D meshes";

  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());
  std::cout << "#### Entities associated with DOFs" << std::endl;
  for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
    const lf::mesh::Entity &e(dof_handler.Entity(dof_idx));
    std::cout << "dof " << dof_idx << " -> " << e << " " << mesh.Index(e)
              << std::endl;
    std::span<const lf::assemble::gdof_idx_t> doflist(
        dof_handler.GlobalDofIndices(e));
    bool dof_found = false;
    for (const lf::assemble::gdof_idx_t &dof : doflist) {
      if (dof == dof_idx) {
        dof_found = true;
        break;
      }
    }
    EXPECT_TRUE(dof_found) << "DOF " << dof_idx << " not in list for " << e
                           << " " << mesh.Index(e);
  }
}